

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall PFData::getSubgridIndexY(PFData *this,int idx)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  PFData *in_RDI;
  int size;
  int start;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  iVar1 = getNormalBlockStartY
                    ((PFData *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar2 = getNormalBlockSizeY(in_RDI);
  if (in_ESI < iVar1) {
    local_4 = in_ESI / (iVar2 + 1);
  }
  else {
    local_4 = in_RDI->m_ny % in_RDI->m_q + (in_ESI - iVar1) / iVar2;
  }
  return local_4;
}

Assistant:

int PFData::getSubgridIndexY(int idx) const{
    const int start = getNormalBlockStartY();
    const int size = getNormalBlockSizeY();
    if(idx < start){   //In remainder subgrid
        return idx/(size+1);
    }

    //In normal block subgrids
    //Number of remainder blocks + number of normal blocks
    return (m_ny % m_q) + (idx - start)/size;
}